

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::prepareNextTestCase
          (ImplicitConversionsValidTest *this,GLuint test_case_index)

{
  size_type sVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  GLchar *local_1c8;
  GLchar *local_1c0 [3];
  MessageBuilder local_1a8;
  reference local_28;
  testCase *test_case;
  ImplicitConversionsValidTest *pIStack_18;
  GLuint test_case_index_local;
  ImplicitConversionsValidTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this_local._7_1_ = true;
  }
  else {
    test_case._4_4_ = test_case_index;
    pIStack_18 = this;
    sVar1 = std::
            vector<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
            ::size(&this->m_test_cases);
    if (test_case._4_4_ < sVar1) {
      local_28 = std::
                 vector<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
                 ::operator[](&this->m_test_cases,(ulong)test_case._4_4_);
      this_00 = deqp::Context::getTestContext(*(Context **)&this->field_0x70);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [4])"T1:");
      local_1c0[0] = Utils::getTypeName((local_28->m_types).m_t1,local_28->m_n_cols,
                                        local_28->m_n_rows);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1c0);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [5])" T2:");
      local_1c8 = Utils::getTypeName((local_28->m_types).m_t2,local_28->m_n_cols,local_28->m_n_rows)
      ;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c8);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ImplicitConversionsValidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "T1:" << Utils::getTypeName(test_case.m_types.m_t1, test_case.m_n_cols,
																	   test_case.m_n_rows)
										<< " T2:" << Utils::getTypeName(test_case.m_types.m_t2, test_case.m_n_cols,
																		test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}